

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionValue::parse_default
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details)

{
  element_type *peVar1;
  shared_ptr<const_cxxopts::OptionDetails> *in_RDI;
  shared_ptr<const_cxxopts::OptionDetails> *in_stack_ffffffffffffffb8;
  shared_ptr<const_cxxopts::OptionDetails> *in_stack_ffffffffffffffd8;
  OptionValue *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<const_cxxopts::OptionDetails>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  ensure_value(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<const_cxxopts::OptionDetails>::~shared_ptr
            ((shared_ptr<const_cxxopts::OptionDetails> *)0x1442d2);
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1442dc);
  (*peVar1->_vptr_Value[4])();
  return;
}

Assistant:

void
        parse_default(std::shared_ptr<const OptionDetails> details)
        {
            ensure_value(details);
            m_value->parse();
        }